

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

int TPZFMatrix<std::complex<float>_>::Error(char *msg1,char *msg2)

{
  ostream *poVar1;
  ostringstream out;
  char *local_1b0 [4];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"TPZFMatrix::");
  std::operator<<(poVar1,msg1);
  if (msg2 != (char *)0x0) {
    std::operator<<((ostream *)local_190,msg2);
  }
  std::operator<<((ostream *)local_190,".\n");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cout,local_1b0[0]);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_1b0);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.cpp"
             ,0x878);
}

Assistant:

int TPZFMatrix<TVar>::Error(const char *msg1,const char *msg2 ) {
    ostringstream out;
    out << "TPZFMatrix::" << msg1;
    if(msg2) out << msg2;
    out << ".\n";
    LOGPZ_ERROR (logger, out.str().c_str());
    DebugStop();
    return 0;
}